

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ostream * Kandinsky::operator<<(ostream *stream,Expression *expression)

{
  long *in_RSI;
  ostream *in_RDI;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(local_30,in_RSI,0);
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const Expression& expression) {
        stream << expression.toString();
        return stream;
    }